

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-flat-test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_171e31::
InterfaceTester_QuadraticConstraint_QuadConstraintIsPassedToBackend__OldSyntax_Test::
~InterfaceTester_QuadraticConstraint_QuadConstraintIsPassedToBackend__OldSyntax_Test
          (InterfaceTester_QuadraticConstraint_QuadConstraintIsPassedToBackend__OldSyntax_Test *this
          )

{
  void *in_RDI;
  
  ~InterfaceTester_QuadraticConstraint_QuadConstraintIsPassedToBackend__OldSyntax_Test
            ((InterfaceTester_QuadraticConstraint_QuadConstraintIsPassedToBackend__OldSyntax_Test *)
             0x149258);
  operator_delete(in_RDI,0x82d8);
  return;
}

Assistant:

TEST_F(InterfaceTester_QuadraticConstraint, QuadConstraintIsPassedToBackend__OldSyntax) {
  auto con=GetModel().AddCon(5.0, 5.0);
  const auto args = GetInterface().AddVars(2, -1.0, 11.0);
  con.set_nonlinear_expr(GetModel().MakeBinary(mp::expr::MUL,
                                               GetModel().MakeVariable( args[0] ),
                                               GetModel().MakeVariable( args[1] ) ) );
  GetInterface().ConvertModel();
  auto qt = mp::QuadTerms{ {1.0}, {args[0]}, {args[1]} };
  ASSERT_HAS_CONSTRAINT( GetBackend(), mp::QuadConRange(
                           { mp::LinTerms{}, std::move(qt) },
    {5.0, 5.0} ) );
}